

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

int run_test(int inprocess)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_thread_t tid;
  uv_process_t process;
  
  if (inprocess == 0) {
    spawn_helper(&ctx.channel,&process,"ipc_send_recv_helper");
    connect_cb(&ctx.connect_req,0);
LAB_0014eb82:
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    eval_b = (int64_t)iVar1;
    eval_b_2 = 0;
    if ((void *)eval_b == (void *)0x0) {
      eval_b = 2;
      eval_b_2 = (int64_t)recv_cb_count;
      iVar1 = 2;
      if (eval_b_2 == 2) {
        if (inprocess != 0) {
          iVar1 = uv_thread_join(&tid);
          eval_b = (int64_t)iVar1;
          eval_b_2 = 0;
          if ((void *)eval_b != (void *)0x0) {
            pcVar5 = "0";
            pcVar4 = "r";
            uVar3 = 200;
            goto LAB_0014ed1e;
          }
        }
        return iVar1;
      }
      pcVar5 = "recv_cb_count";
      pcVar4 = "2";
      uVar3 = 0xc4;
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0xc2;
    }
  }
  else {
    iVar1 = uv_thread_create(&tid,ipc_send_recv_helper_threadproc,(void *)0x2a);
    process.data = (void *)(long)iVar1;
    if (process.data == (void *)0x0) {
      uv_sleep(1000);
      puVar2 = uv_default_loop();
      iVar1 = uv_pipe_init(puVar2,&ctx.channel,1);
      process.data = (void *)(long)iVar1;
      if (process.data == (void *)0x0) {
        uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
        goto LAB_0014eb82;
      }
      uVar3 = 0xb8;
    }
    else {
      uVar3 = 0xb3;
    }
    pcVar5 = "0";
    pcVar4 = "r";
    eval_b_2 = 0;
    eval_b = (int64_t)process.data;
  }
LAB_0014ed1e:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

static int run_test(int inprocess) {
  uv_process_t process;
  uv_thread_t tid;
  int r;

  if (inprocess) {
    r = uv_thread_create(&tid, ipc_send_recv_helper_threadproc, (void *) 42);
    ASSERT_OK(r);

    uv_sleep(1000);

    r = uv_pipe_init(uv_default_loop(), &ctx.channel, 1);
    ASSERT_OK(r);

    uv_pipe_connect(&ctx.connect_req, &ctx.channel, TEST_PIPENAME_3, connect_cb);
  } else {
    spawn_helper(&ctx.channel, &process, "ipc_send_recv_helper");

    connect_cb(&ctx.connect_req, 0);
  }

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(2, recv_cb_count);

  if (inprocess) {
    r = uv_thread_join(&tid);
    ASSERT_OK(r);
  }

  return 0;
}